

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

Fad<long_double> * __thiscall
TPZFMatrix<Fad<long_double>_>::GetVal
          (Fad<long_double> *__return_storage_ptr__,TPZFMatrix<Fad<long_double>_> *this,int64_t row,
          int64_t col)

{
  Fad<long_double>::Fad
            (__return_storage_ptr__,
             this->fElem +
             col * (this->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow + row);
  return __return_storage_ptr__;
}

Assistant:

inline const TVar TPZFMatrix<TVar>::GetVal( const int64_t row, const int64_t col ) const {
    return( fElem[ col*this->fRow + row ] );
}